

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::TextureViewVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::TextureViewVkImpl>::operator=
          (RefCntAutoPtr<Diligent::TextureViewVkImpl> *this,TextureViewVkImpl *pObj)

{
  TextureViewVkImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this_00 != pObj) {
    if (this_00 != (TextureViewVkImpl *)0x0) {
      DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
      ::Release((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                 *)this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (TextureViewVkImpl *)0x0) {
      RefCountedObject<Diligent::ITextureViewVk>::AddRef
                ((RefCountedObject<Diligent::ITextureViewVk> *)pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }